

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmEnterFrame(jx9_vm *pVm,void *pUserData,VmFrame **ppFrame)

{
  VmFrame *__s;
  ProcCmp in_RCX;
  ProcHash xHash;
  sxi32 sVar1;
  
  __s = (VmFrame *)SyMemBackendPoolAlloc(&pVm->sAllocator,0xb0);
  if (__s == (VmFrame *)0x0) {
    sVar1 = -1;
  }
  else {
    sVar1 = 0;
    memset(__s,0,0xb0);
    __s->pUserData = pUserData;
    __s->pVm = pVm;
    SyHashInit(&__s->hVar,&pVm->sAllocator,xHash,in_RCX);
    (__s->sArg).nUsed = 0;
    (__s->sArg).nSize = 0;
    (__s->sArg).eSize = 0x10;
    (__s->sArg).nCursor = 0;
    (__s->sArg).pAllocator = &pVm->sAllocator;
    (__s->sArg).pBase = (void *)0x0;
    (__s->sArg).pUserData = (void *)0x0;
    (__s->sLocal).nUsed = 0;
    (__s->sLocal).nSize = 0;
    (__s->sLocal).eSize = 0x10;
    (__s->sLocal).nCursor = 0;
    (__s->sLocal).pAllocator = &pVm->sAllocator;
    (__s->sLocal).pBase = (void *)0x0;
    (__s->sLocal).pUserData = (void *)0x0;
    __s->pParent = pVm->pFrame;
    pVm->pFrame = __s;
    if (ppFrame != (VmFrame **)0x0) {
      *ppFrame = __s;
    }
  }
  return sVar1;
}

Assistant:

static sxi32 VmEnterFrame(
	jx9_vm *pVm,               /* Target VM */
	void *pUserData,           /* Upper-layer private data */
	VmFrame **ppFrame          /* OUT: Top most active frame */
	)
{
	VmFrame *pFrame;
	/* Allocate a new frame */
	pFrame = VmNewFrame(&(*pVm), pUserData);
	if( pFrame == 0 ){
		return SXERR_MEM;
	}
	/* Link to the list of active VM frame */
	pFrame->pParent = pVm->pFrame;
	pVm->pFrame = pFrame;
	if( ppFrame ){
		/* Write a pointer to the new VM frame */
		*ppFrame = pFrame;
	}
	return SXRET_OK;
}